

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O1

UINT8 __thiscall S98Player::LoadTags(S98Player *this)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer ppcVar4;
  bool bVar5;
  size_type sVar6;
  UINT32 UVar7;
  int iVar8;
  UINT8 *pUVar9;
  mapped_type *this_00;
  _Alloc_hider _Var10;
  _Base_ptr p_Var11;
  int *startPtr;
  iterator iVar12;
  char *pcVar13;
  char **ppcVar14;
  int *startPtr_00;
  string tagData;
  char *tagName;
  string local_88;
  vector<char_const*,std::allocator<char_const*>> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  key_type local_58;
  _Rb_tree_node_base *local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->_tagData)._M_t);
  ppcVar4 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar4) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar4;
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  iVar12._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,iVar12,
               (char **)&local_88);
  }
  else {
    *iVar12._M_current = (char *)0x0;
    pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  uVar3 = (this->_fileHdr).tagOfs;
  if (uVar3 == 0) {
    return '\0';
  }
  UVar7 = DataLoader_GetSize(this->_dLoad);
  if (UVar7 <= uVar3) {
    return 0xf3;
  }
  startPtr_00 = (int *)(this->_fileData + (this->_fileHdr).tagOfs);
  local_68 = (vector<char_const*,std::allocator<char_const*>> *)&this->_tagList;
  UVar7 = DataLoader_GetSize(this->_dLoad);
  pUVar9 = (UINT8 *)memchr(startPtr_00,0,(ulong)(UVar7 - (this->_fileHdr).tagOfs));
  if (pUVar9 == (UINT8 *)0x0) {
    pUVar9 = this->_fileData;
    UVar7 = DataLoader_GetSize(this->_dLoad);
    pUVar9 = pUVar9 + UVar7;
  }
  if ((this->_fileHdr).fileVer < 3) {
    GetUTF8String_abi_cxx11_(&local_88,this,(char *)startPtr_00,(char *)pUVar9);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TITLE","");
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->_tagData,&local_58);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_001131fa;
  }
  else {
    paVar2 = &local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar2;
    if (((long)pUVar9 - (long)startPtr_00 < 5) ||
       ((char)startPtr_00[1] != ']' || *startPtr_00 != 0x3839535b)) {
      emu_logf(&this->_logger,'\x01',"Invalid S98 tag data!\n");
      emu_logf(&this->_logger,'\x04',"tagData size: %zu, Signature: %.5s\n",
               (long)pUVar9 - (long)startPtr_00,startPtr_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      return 0xf0;
    }
    startPtr = (int *)((long)startPtr_00 + 5);
    if (((long)pUVar9 - (long)startPtr < 3) ||
       (*(char *)((long)startPtr_00 + 7) != -0x41 || *(short *)startPtr != -0x4411)) {
      bVar5 = false;
    }
    else {
      emu_logf(&this->_logger,'\x04',"Note: Tags are UTF-8 encoded.\n");
      startPtr = startPtr_00 + 2;
      bVar5 = true;
    }
    if (bVar5) {
      std::__cxx11::string::replace
                ((ulong)&local_88,0,(char *)local_88._M_string_length,(ulong)startPtr);
    }
    else {
      GetUTF8String_abi_cxx11_(&local_58,this,(char *)startPtr,(char *)pUVar9);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    ParsePSFTags(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar2) goto LAB_001131fa;
  }
  operator_delete(local_88._M_dataplus._M_p,
                  CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                           local_88.field_2._M_local_buf[0]) + 1);
LAB_001131fa:
  ppcVar4 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar4) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar4;
  }
  p_Var11 = (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 != local_38) {
    do {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*(long *)(p_Var11 + 1),
                 (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
      sVar6 = local_88._M_string_length;
      _Var10._M_p = local_88._M_dataplus._M_p;
      if ((char *)local_88._M_string_length != (char *)0x0) {
        pcVar13 = (char *)0x0;
        do {
          iVar8 = toupper((int)_Var10._M_p[(long)pcVar13]);
          _Var10._M_p[(long)pcVar13] = (char)iVar8;
          pcVar13 = pcVar13 + 1;
        } while ((char *)sVar6 != pcVar13);
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
      ppcVar14 = S98_TAG_MAPPING;
      do {
        ppcVar14 = ppcVar14 + 2;
        iVar8 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar8 == 0) {
          local_58._M_dataplus._M_p = ppcVar14[-1];
          break;
        }
      } while (*ppcVar14 != (char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88._M_dataplus._M_p;
        iVar12._M_current =
             (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        _Var10._M_p = local_88._M_dataplus._M_p;
        if (iVar12._M_current !=
            (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) goto LAB_001132fd;
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (local_68,iVar12,(char **)&local_60);
      }
      else {
        iVar12._M_current =
             (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        _Var10._M_p = local_58._M_dataplus._M_p;
        if (iVar12._M_current ==
            (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    (local_68,iVar12,(char **)&local_58);
        }
        else {
LAB_001132fd:
          *iVar12._M_current = _Var10._M_p;
          pppcVar1 = &(this->_tagList).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      local_60 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(p_Var11 + 2);
      iVar12._M_current =
           (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (local_68,iVar12,(char **)&local_60);
      }
      else {
        *iVar12._M_current = (char *)local_60;
        pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != local_38);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  iVar12._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              (local_68,iVar12,(char **)&local_88);
  }
  else {
    *iVar12._M_current = (char *)0x0;
    pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return '\0';
}

Assistant:

UINT8 S98Player::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	_tagList.push_back(NULL);
	if (! _fileHdr.tagOfs)
		return 0x00;
	if (_fileHdr.tagOfs >= DataLoader_GetSize(_dLoad))
		return 0xF3;	// tag error (offset out-of-range)
	
	const char* startPtr;
	const char* endPtr;
	
	// find end of string (can be either '\0' or EOF)
	startPtr = (const char*)&_fileData[_fileHdr.tagOfs];
	endPtr = (const char*)memchr(startPtr, '\0', DataLoader_GetSize(_dLoad) - _fileHdr.tagOfs);
	if (endPtr == NULL)
		endPtr = (const char*)_fileData + DataLoader_GetSize(_dLoad);
	
	if (_fileHdr.fileVer < 3)
	{
		// tag offset = song title (\0-terminated)
		_tagData["TITLE"] = GetUTF8String(startPtr, endPtr);
	}
	else
	{
		std::string tagData;
		bool tagIsUTF8 = false;
		
		// tag offset = PSF tag
		if (endPtr - startPtr < 5 || memcmp(startPtr, "[S98]", 5))
		{
			emu_logf(&_logger, PLRLOG_ERROR, "Invalid S98 tag data!\n");
			emu_logf(&_logger, PLRLOG_DEBUG, "tagData size: %zu, Signature: %.5s\n", endPtr - startPtr, startPtr);
			return 0xF0;
		}
		startPtr += 5;
		if (endPtr - startPtr >= 3)
		{
			if (! memcmp(&startPtr[0], "\xEF\xBB\xBF", 3))	// check for UTF-8 BOM
			{
				tagIsUTF8 = true;
				startPtr += 3;
				emu_logf(&_logger, PLRLOG_DEBUG, "Note: Tags are UTF-8 encoded.\n");
			}
		}
		
		if (tagIsUTF8)
			tagData.assign(startPtr, endPtr);
		else
			tagData = GetUTF8String(startPtr, endPtr);
		ParsePSFTags(tagData);
	}
	
	_tagList.clear();
	
	std::map<std::string, std::string>::const_iterator mapIt;
	for (mapIt = _tagData.begin(); mapIt != _tagData.end(); ++ mapIt)
	{
		std::string curKey = mapIt->first;
		std::transform(curKey.begin(), curKey.end(), curKey.begin(), ::toupper);
		
		const char *tagName = NULL;
		for (const char* const* t = S98_TAG_MAPPING; *t != NULL; t += 2)
		{
			if (curKey == t[0])
			{
				tagName = t[1];
				break;
			}
		}
		
		if (tagName)
			_tagList.push_back(tagName);
		else
			_tagList.push_back(curKey.c_str());
		_tagList.push_back(mapIt->second.c_str());
	}
	
	_tagList.push_back(NULL);
	
	return 0x00;
}